

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

opj_image_t * bmp8toimage(OPJ_UINT8 *pData,OPJ_UINT32 stride,opj_image_t *image,OPJ_UINT8 **pLUT)

{
  OPJ_UINT32 height_00;
  OPJ_UINT32 local_64;
  OPJ_UINT32 local_60;
  OPJ_INT32 pDstStride [3];
  OPJ_INT32 *pDst [3];
  OPJ_UINT8 *pSrc;
  OPJ_UINT32 height;
  OPJ_UINT32 width;
  OPJ_UINT8 **pLUT_local;
  opj_image_t *image_local;
  OPJ_UINT32 stride_local;
  OPJ_UINT8 *pData_local;
  
  local_64 = image->comps->w;
  height_00 = image->comps->h;
  if (image->numcomps == 1) {
    opj_applyLUT8u_8u32s_C1R
              (pData + (height_00 - 1) * stride,-stride,image->comps->data,local_64,*pLUT,local_64,
               height_00);
  }
  else {
    pDstStride._4_8_ = image->comps->data;
    local_60 = local_64;
    pDstStride[0] = local_64;
    opj_applyLUT8u_8u32s_C1P3R
              (pData + (height_00 - 1) * stride,-stride,(OPJ_INT32 **)(pDstStride + 1),
               (OPJ_INT32 *)&local_64,pLUT,local_64,height_00);
  }
  return image;
}

Assistant:

static opj_image_t* bmp8toimage(const OPJ_UINT8* pData, OPJ_UINT32 stride, opj_image_t* image, OPJ_UINT8 const* const* pLUT)
{
	OPJ_UINT32 width, height;
	const OPJ_UINT8 *pSrc = NULL;
	
	width  = image->comps[0].w;
	height = image->comps[0].h;
	
	pSrc = pData + (height - 1U) * stride;
	if (image->numcomps == 1U) {
		opj_applyLUT8u_8u32s_C1R(pSrc, -(OPJ_INT32)stride, image->comps[0].data, (OPJ_INT32)width, pLUT[0], width, height);
	}
	else {
		OPJ_INT32* pDst[3];
		OPJ_INT32  pDstStride[3];
		
		pDst[0] = image->comps[0].data; pDst[1] = image->comps[1].data; pDst[2] = image->comps[2].data;
		pDstStride[0] = (OPJ_INT32)width; pDstStride[1] = (OPJ_INT32)width; pDstStride[2] = (OPJ_INT32)width;
		opj_applyLUT8u_8u32s_C1P3R(pSrc, -(OPJ_INT32)stride, pDst, pDstStride, pLUT, width, height);
	}
	return image;
}